

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptNumber.cpp
# Opt level: O1

bool Js::JavascriptNumber::IsInt32_NoChecks(Var number)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  double value;
  
  if (number == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                                ,0x94,"(number)","number");
    if (!bVar2) goto LAB_00ce8c7d;
    *puVar3 = 0;
  }
  if ((ulong)number >> 0x32 != 0) {
LAB_00ce8c3d:
    value = (double)((ulong)number ^ 0xfffc000000000000);
    if (((double)(int)value != value) || (NAN((double)(int)value) || NAN(value))) {
      bVar2 = false;
    }
    else {
      bVar2 = NumberUtilities::IsSpecial(value,0x8000000000000000);
      bVar2 = !bVar2;
    }
    return bVar2;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
  *puVar3 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptNumber.cpp"
                              ,0x95,"(Is(number))","Is(number)");
  if (bVar2) {
    *puVar3 = 0;
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Library/JavascriptNumber.h"
                                ,0xd4,"(Is(aValue))","Ensure var is actually a \'JavascriptNumber\'"
                               );
    if (bVar2) {
      *puVar3 = 0;
      goto LAB_00ce8c3d;
    }
  }
LAB_00ce8c7d:
  pcVar1 = (code *)invalidInstructionException();
  (*pcVar1)();
}

Assistant:

bool JavascriptNumber::IsInt32_NoChecks(const Var number)
    {
        Assert(number);
        Assert(Is(number));

        return IsInt32(GetValue(number));
    }